

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.cpp
# Opt level: O0

void Reshape(void)

{
  GLsizei local_10;
  GLsizei local_c;
  int height;
  int width;
  
  glfwGetFramebufferSize(window,&local_c,&local_10);
  (*debugMessageInsert)(7,"Reshape-- this should not be included");
  (*pushDebugGroup)(7,"Reshape-- this should not be included");
  (*glad_glViewport)(0,0,local_c,local_10);
  (*glad_glMatrixMode)(0x1701);
  (*glad_glLoadIdentity)();
  (*glad_glOrtho)(-1.0,1.0,-1.0,1.0,-0.5,1000.0);
  (*glad_glMatrixMode)(0x1700);
  (*popDebugGroup)();
  return;
}

Assistant:

static void Reshape(void)
{
    int width, height;
    glfwGetFramebufferSize(window, &width, &height);

    debugMessageInsert(strlen("Reshape"), "Reshape" "-- this should not be included");
    pushDebugGroup(strlen("Reshape"), "Reshape" "-- this should not be included");

    glViewport(0, 0, (GLint)width, (GLint)height);

    glMatrixMode(GL_PROJECTION);
    glLoadIdentity();
    glOrtho(-1.0, 1.0, -1.0, 1.0, -0.5, 1000.0);
    glMatrixMode(GL_MODELVIEW);

    popDebugGroup();
}